

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcursor.cpp
# Opt level: O0

void change_setting_proc(Am_Object *cmd)

{
  undefined1 uVar1;
  Am_Value *value;
  char *pcVar2;
  Am_Wrapper *pAVar3;
  Am_Style local_148 [8];
  Am_Style local_140 [8];
  Am_Image_Array local_138 [8];
  Am_Image_Array local_130 [8];
  Am_Cursor local_128 [8];
  Am_Image_Array local_120 [8];
  Am_Image_Array local_118 [8];
  Am_Style local_110 [8];
  Am_Style local_108 [8];
  Am_Image_Array local_100 [8];
  Am_Image_Array local_f8 [8];
  Am_Cursor local_f0 [8];
  Am_Image_Array local_e8 [8];
  Am_Image_Array local_e0 [8];
  Am_Style local_d8 [8];
  Am_Style local_d0 [8];
  Am_Image_Array local_c8 [8];
  Am_Image_Array local_c0 [8];
  Am_Cursor local_b8 [8];
  Am_Image_Array local_b0 [8];
  Am_Image_Array local_a8 [8];
  Am_Style local_a0 [8];
  Am_Style local_98 [8];
  Am_Image_Array local_90 [8];
  Am_Image_Array local_88 [8];
  Am_Cursor local_80 [8];
  Am_Image_Array local_78 [8];
  Am_Image_Array local_70 [8];
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Image_Array local_58 [8];
  Am_Image_Array local_50 [8];
  Am_Cursor local_48 [8];
  Am_Image_Array local_40 [8];
  Am_Image_Array local_38 [28];
  Am_Input_Char local_1c;
  Am_Input_Char c;
  Am_Object inter;
  Am_Object *cmd_local;
  
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)cmd);
  value = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&stack0xffffffffffffffe8,0x11b);
  Am_Input_Char::Am_Input_Char(&local_1c,value);
  uVar1 = Am_Input_Char::As_Char();
  switch(uVar1) {
  case 0x31:
    pcVar2 = (char *)Am_Merge_Pathname("images/happy.xbm");
    Am_Image_Array::Am_Image_Array(local_38,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_38);
    Am_Image_Array::~Am_Image_Array(local_38);
    pcVar2 = (char *)Am_Merge_Pathname("images/happy_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_40,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_40);
    Am_Image_Array::~Am_Image_Array(local_40);
    Am_Image_Array::Am_Image_Array(local_50,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_58,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_60,(Am_Style *)&Am_Red);
    Am_Style::Am_Style(local_68,(Am_Style *)&Am_Yellow);
    Am_Cursor::Am_Cursor(local_48,local_50,local_58,local_60,local_68);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,local_48);
    Am_Cursor::~Am_Cursor(local_48);
    Am_Style::~Am_Style(local_68);
    Am_Style::~Am_Style(local_60);
    Am_Image_Array::~Am_Image_Array(local_58);
    Am_Image_Array::~Am_Image_Array(local_50);
    pAVar3 = Am_Cursor::operator_cast_to_Am_Wrapper_((Am_Cursor *)&my_cursor);
    Am_Object::Set(0x71e0,(Am_Wrapper *)0x7e,(ulong)pAVar3);
    break;
  case 0x32:
    pcVar2 = (char *)Am_Merge_Pathname("images/ds9.xbm");
    Am_Image_Array::Am_Image_Array(local_70,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_70);
    Am_Image_Array::~Am_Image_Array(local_70);
    pcVar2 = (char *)Am_Merge_Pathname("images/ds9_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_78,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_78);
    Am_Image_Array::~Am_Image_Array(local_78);
    Am_Image_Array::Am_Image_Array(local_88,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_90,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_98,(Am_Style *)&Am_Blue);
    Am_Style::Am_Style(local_a0,(Am_Style *)&Am_Green);
    Am_Cursor::Am_Cursor(local_80,local_88,local_90,local_98,local_a0);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,local_80);
    Am_Cursor::~Am_Cursor(local_80);
    Am_Style::~Am_Style(local_a0);
    Am_Style::~Am_Style(local_98);
    Am_Image_Array::~Am_Image_Array(local_90);
    Am_Image_Array::~Am_Image_Array(local_88);
    pAVar3 = Am_Cursor::operator_cast_to_Am_Wrapper_((Am_Cursor *)&my_cursor);
    Am_Object::Set(0x71e0,(Am_Wrapper *)0x7e,(ulong)pAVar3);
    break;
  case 0x33:
    pcVar2 = (char *)Am_Merge_Pathname("images/borg.xbm");
    Am_Image_Array::Am_Image_Array(local_a8,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_a8);
    Am_Image_Array::~Am_Image_Array(local_a8);
    pcVar2 = (char *)Am_Merge_Pathname("images/borg_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_b0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_b0);
    Am_Image_Array::~Am_Image_Array(local_b0);
    Am_Image_Array::Am_Image_Array(local_c0,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_c8,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_d0,(Am_Style *)&Am_Purple);
    Am_Style::Am_Style(local_d8,(Am_Style *)&Am_Orange);
    Am_Cursor::Am_Cursor(local_b8,local_c0,local_c8,local_d0,local_d8);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,local_b8);
    Am_Cursor::~Am_Cursor(local_b8);
    Am_Style::~Am_Style(local_d8);
    Am_Style::~Am_Style(local_d0);
    Am_Image_Array::~Am_Image_Array(local_c8);
    Am_Image_Array::~Am_Image_Array(local_c0);
    pAVar3 = Am_Cursor::operator_cast_to_Am_Wrapper_((Am_Cursor *)&my_cursor);
    Am_Object::Set(0x71e0,(Am_Wrapper *)0x7e,(ulong)pAVar3);
    break;
  case 0x34:
    pcVar2 = (char *)Am_Merge_Pathname("images/crosshair.xbm");
    Am_Image_Array::Am_Image_Array(local_e0,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_e0);
    Am_Image_Array::~Am_Image_Array(local_e0);
    pcVar2 = (char *)Am_Merge_Pathname("images/crosshair_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_e8,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_e8);
    Am_Image_Array::~Am_Image_Array(local_e8);
    Am_Image_Array::Am_Image_Array(local_f8,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_100,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_108,(Am_Style *)&Am_Yellow);
    Am_Style::Am_Style(local_110,(Am_Style *)&Am_Black);
    Am_Cursor::Am_Cursor(local_f0,local_f8,local_100,local_108,local_110);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,local_f0);
    Am_Cursor::~Am_Cursor(local_f0);
    Am_Style::~Am_Style(local_110);
    Am_Style::~Am_Style(local_108);
    Am_Image_Array::~Am_Image_Array(local_100);
    Am_Image_Array::~Am_Image_Array(local_f8);
    pAVar3 = Am_Cursor::operator_cast_to_Am_Wrapper_((Am_Cursor *)&my_cursor);
    Am_Object::Set(0x71e0,(Am_Wrapper *)0x7e,(ulong)pAVar3);
    break;
  case 0x35:
    pcVar2 = (char *)Am_Merge_Pathname("images/rom.xbm");
    Am_Image_Array::Am_Image_Array(local_118,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&full_image,local_118);
    Am_Image_Array::~Am_Image_Array(local_118);
    pcVar2 = (char *)Am_Merge_Pathname("images/rom_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_120,pcVar2);
    Am_Image_Array::operator=((Am_Image_Array *)&mask_image,local_120);
    Am_Image_Array::~Am_Image_Array(local_120);
    Am_Image_Array::Am_Image_Array(local_130,(Am_Image_Array *)&full_image);
    Am_Image_Array::Am_Image_Array(local_138,(Am_Image_Array *)&mask_image);
    Am_Style::Am_Style(local_140,(Am_Style *)&Am_White);
    Am_Style::Am_Style(local_148,(Am_Style *)&Am_Red);
    Am_Cursor::Am_Cursor(local_128,local_130,local_138,local_140,local_148);
    Am_Cursor::operator=((Am_Cursor *)&my_cursor,local_128);
    Am_Cursor::~Am_Cursor(local_128);
    Am_Style::~Am_Style(local_148);
    Am_Style::~Am_Style(local_140);
    Am_Image_Array::~Am_Image_Array(local_138);
    Am_Image_Array::~Am_Image_Array(local_130);
    pAVar3 = Am_Cursor::operator_cast_to_Am_Wrapper_((Am_Cursor *)&my_cursor);
    Am_Object::Set(0x71e0,(Am_Wrapper *)0x7e,(ulong)pAVar3);
    break;
  case 0x36:
    pAVar3 = Am_Cursor::operator_cast_to_Am_Wrapper_((Am_Cursor *)&Am_Default_Cursor);
    Am_Object::Set(0x71e0,(Am_Wrapper *)0x7e,(ulong)pAVar3);
    break;
  case 0x71:
    Am_Exit_Main_Event_Loop();
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);

  switch (c.As_Char()) {
  case '1': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_HAPPY));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_HAPPY_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_Red, Am_Yellow);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '2': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_DS9));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_DS9_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_Blue, Am_Green);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '3': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_BORG));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_BORG_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_Purple, Am_Orange);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '4': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_CROSSHR));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_CROSSHR_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_Yellow, Am_Black);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '5': {
    full_image = Am_Image_Array(Am_Merge_Pathname(IMFN_ROM));
    mask_image = Am_Image_Array(Am_Merge_Pathname(IMFN_ROM_M));
    my_cursor = Am_Cursor(full_image, mask_image, Am_White, Am_Red);
    window.Set(Am_CURSOR, my_cursor);
    break;
  }
  case '6': {
    window.Set(Am_CURSOR, Am_Default_Cursor);
    break;
  }
  case 'q': {
    Am_Exit_Main_Event_Loop();
    break;
  }
  }
}